

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  TestRunStats *this_00;
  TestRunInfo *in_RDI;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  RunContext *in_stack_ffffffffffffff70;
  AssertionResult *this_01;
  undefined1 local_60 [8];
  undefined1 local_58 [88];
  
  *(undefined ***)in_RDI = &PTR__RunContext_00220360;
  *(undefined ***)&in_RDI->field_0x8 = &PTR__RunContext_002203c8;
  this_00 = (TestRunStats *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 9));
  aborting(in_stack_ffffffffffffff70);
  TestRunStats::TestRunStats
            (this_00,in_RDI,(Totals *)in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  (*this_00->_vptr_TestRunStats[0xf])(this_00,local_58);
  TestRunStats::~TestRunStats((TestRunStats *)0x1c9ecf);
  (**(code **)(**(long **)&in_RDI[1].field_0x10 + 0x40))
            (*(long **)&in_RDI[1].field_0x10,*(undefined8 *)(in_RDI + 10));
  this_01 = *(AssertionResult **)&in_RDI[1].field_0x10;
  Ptr<const_Catch::IConfig>::Ptr
            ((Ptr<const_Catch::IConfig> *)this_01,
             (IConfig *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  (*(code *)(*(IConfig **)&this_01->m_info)[9].super_IShared.super_NonCopyable._vptr_NonCopyable)
            (this_01,local_60);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)this_01);
  (**(code **)(**(long **)&in_RDI[1].field_0x10 + 0x38))
            (*(long **)&in_RDI[1].field_0x10,*(undefined8 *)&in_RDI[10].field_0x8);
  (**(code **)(**(long **)&in_RDI[1].field_0x10 + 0x48))
            (*(long **)&in_RDI[1].field_0x10,&in_RDI[10].field_0x10);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::~vector((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
             *)this_00);
  AssertionInfo::~AssertionInfo(&this_01->m_info);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)this_01);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_00);
  Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)this_01);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)this_01);
  AssertionResult::~AssertionResult(this_01);
  TestRunInfo::~TestRunInfo((TestRunInfo *)0x1c9fdf);
  IRunner::~IRunner((IRunner *)&in_RDI->field_0x8);
  IResultCapture::~IResultCapture((IResultCapture *)in_RDI);
  return;
}

Assistant:

virtual ~RunContext() {
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, aborting() ) );
            m_context.setRunner( m_prevRunner );
            m_context.setConfig( NULL );
            m_context.setResultCapture( m_prevResultCapture );
            m_context.setConfig( m_prevConfig );
        }